

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarAddTab(ImGuiTabBar *tab_bar,ImGuiTabItemFlags tab_flags,ImGuiWindow *window)

{
  ImGuiTabItem *pIVar1;
  ImGuiID IVar2;
  int iVar3;
  ulong uVar4;
  ImGuiTabItem *in_RAX;
  ImGuiTabItem *pIVar5;
  ImGuiTabItem *pIVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  
  IVar2 = window->ID;
  if (IVar2 != 0) {
    uVar8 = (ulong)(tab_bar->Tabs).Size;
    bVar12 = 0 < (long)uVar8;
    if (0 < (long)uVar8) {
      in_RAX = (tab_bar->Tabs).Data;
      bVar12 = true;
      if (in_RAX->ID != IVar2) {
        pIVar6 = in_RAX + (uVar8 - 1);
        pIVar5 = in_RAX;
        uVar4 = 1;
        do {
          uVar10 = uVar4;
          in_RAX = pIVar6;
          if (uVar8 == uVar10) break;
          in_RAX = pIVar5 + 1;
          pIVar1 = pIVar5 + 1;
          pIVar5 = in_RAX;
          uVar4 = uVar10 + 1;
        } while (pIVar1->ID != IVar2);
        bVar12 = uVar10 < uVar8;
      }
    }
    if (bVar12) goto LAB_002bc62b;
  }
  in_RAX = (ImGuiTabItem *)0x0;
LAB_002bc62b:
  if (in_RAX != (ImGuiTabItem *)0x0) {
    __assert_fail("TabBarFindTabByID(tab_bar, window->ID) == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x1c8c,
                  "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
  }
  if (GImGui->CurrentTabBar == tab_bar) {
    __assert_fail("g.CurrentTabBar != tab_bar",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x1c8d,
                  "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
  }
  iVar11 = tab_bar->CurrFrameVisible;
  if (iVar11 == -1) {
    iVar11 = GImGui->FrameCount + -1;
  }
  iVar9 = (tab_bar->Tabs).Size;
  iVar3 = (tab_bar->Tabs).Capacity;
  if (iVar9 == iVar3) {
    iVar9 = iVar9 + 1;
    if (iVar3 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar3 / 2 + iVar3;
    }
    if (iVar9 < iVar7) {
      iVar9 = iVar7;
    }
    if (iVar3 < iVar9) {
      pIVar6 = (ImGuiTabItem *)MemAlloc((long)iVar9 * 0x30);
      pIVar5 = (tab_bar->Tabs).Data;
      if (pIVar5 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar6,pIVar5,(long)(tab_bar->Tabs).Size * 0x30);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar6;
      (tab_bar->Tabs).Capacity = iVar9;
    }
  }
  pIVar5 = (tab_bar->Tabs).Data;
  iVar9 = (tab_bar->Tabs).Size;
  pIVar5[iVar9].ID = IVar2;
  pIVar5[iVar9].Flags = tab_flags;
  pIVar5[iVar9].Window = window;
  pIVar5[iVar9].LastFrameVisible = iVar11;
  pIVar5[iVar9].LastFrameSelected = -1;
  pIVar6 = pIVar5 + iVar9;
  pIVar6->ContentWidth = 0.0;
  pIVar6->NameOffset = -1;
  pIVar6->BeginOrder = -1;
  pIVar5[iVar9].Offset = 0.0;
  pIVar5[iVar9].Width = 0.0;
  pIVar5[iVar9].IndexDuringLayout = -1;
  *(undefined4 *)&pIVar5[iVar9].WantClose = 0;
  *(undefined2 *)&pIVar5[iVar9].field_0x2e = 0;
  (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + 1;
  return;
}

Assistant:

void ImGui::TabBarAddTab(ImGuiTabBar* tab_bar, ImGuiTabItemFlags tab_flags, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(TabBarFindTabByID(tab_bar, window->ID) == NULL);
    IM_ASSERT(g.CurrentTabBar != tab_bar);  // Can't work while the tab bar is active as our tab doesn't have an X offset yet, in theory we could/should test something like (tab_bar->CurrFrameVisible < g.FrameCount) but we'd need to solve why triggers the commented early-out assert in BeginTabBarEx() (probably dock node going from implicit to explicit in same frame)

    ImGuiTabItem new_tab;
    new_tab.ID = window->ID;
    new_tab.Flags = tab_flags;
    new_tab.LastFrameVisible = tab_bar->CurrFrameVisible;   // Required so BeginTabBar() doesn't ditch the tab
    if (new_tab.LastFrameVisible == -1)
        new_tab.LastFrameVisible = g.FrameCount - 1;
    new_tab.Window = window;                                // Required so tab bar layout can compute the tab width before tab submission
    tab_bar->Tabs.push_back(new_tab);
}